

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::GenerateCompleteStFld
          (Lowerer *this,Instr *instr,bool emitFastPath,JnHelperMethod monoHelperAfterFastPath,
          JnHelperMethod polyHelperAfterFastPath,JnHelperMethod monoHelperWithoutFastPath,
          JnHelperMethod polyHelperWithoutFastPath,bool withPutFlags,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  LabelInstr **ppLVar6;
  JnHelperMethod helperMethod;
  LabelInstr **labelBailOut;
  char isHelper_00;
  PropertyOperationFlags flags_00;
  LabelInstr *local_60;
  RegOpnd *typeOpnd;
  JnHelperMethod local_50;
  JnHelperMethod local_4c;
  Lowerer *local_48;
  LabelInstr *local_40;
  LabelInstr *labelHelper;
  bool isHelper;
  
  typeOpnd._4_4_ = monoHelperAfterFastPath;
  local_48 = this;
  bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0);
  if (((bVar2) && ((instr->field_0x38 & 0x10) != 0)) &&
     (BVar3 = IR::Instr::GetBailOutKind(instr),
     (BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1c75,
                       "(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp)"
                       ,
                       "kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp"
                      );
    if (!bVar2) goto LAB_00547646;
    *puVar4 = 0;
  }
  pIVar5 = instr->m_prev;
  local_40 = (LabelInstr *)0x0;
  labelHelper._7_1_ = '\0';
  local_60 = (LabelInstr *)0x0;
  local_50 = polyHelperAfterFastPath;
  if ((emitFastPath) &&
     (bVar2 = GenerateFastStFldForCustomProperty(local_48,instr,&local_40), bVar2)) {
    if (local_40 == (LabelInstr *)0x0) {
      IR::Instr::Remove(instr);
      return pIVar5;
    }
    if ((local_40->field_0x78 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1c82,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
      if (!bVar2) goto LAB_00547646;
      *puVar4 = 0;
    }
    IR::Instr::InsertBefore(instr,&local_40->super_Instr);
    isHelper_00 = false;
  }
  else {
    labelBailOut = &local_60;
    flags_00 = 0x54750b;
    ppLVar6 = &local_40;
    local_4c = monoHelperWithoutFastPath;
    bVar2 = GenerateStFldWithCachedType
                      (local_48,instr,(bool *)((long)&labelHelper + 7),&local_40,
                       (RegOpnd **)labelBailOut);
    if (bVar2) {
      if (local_40 == (LabelInstr *)0x0) {
        return pIVar5;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1c8e,"(labelHelper == nullptr)","labelHelper == nullptr");
      if (bVar2) {
        *puVar4 = 0;
        return pIVar5;
      }
LAB_00547646:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (emitFastPath) {
      GenerateFastStFld(local_48,instr,helperMethod,(JnHelperMethod)ppLVar6,labelBailOut,
                        (RegOpnd *)local_60,(bool *)((long)&labelHelper + 7),&local_40,false,
                        flags_00);
      monoHelperWithoutFastPath = typeOpnd._4_4_;
      polyHelperWithoutFastPath = local_50;
      isHelper_00 = labelHelper._7_1_;
      if (local_40 != (LabelInstr *)0x0) {
        local_40->field_0x78 = local_40->field_0x78 & 0xfd | labelHelper._7_1_ * '\x02';
        IR::Instr::InsertBefore(instr,&local_40->super_Instr);
        monoHelperWithoutFastPath = typeOpnd._4_4_;
        polyHelperWithoutFastPath = local_50;
        isHelper_00 = labelHelper._7_1_;
      }
    }
    else {
      monoHelperWithoutFastPath = local_4c;
      polyHelperWithoutFastPath = local_4c;
      isHelper_00 = labelHelper._7_1_;
      if (local_40 != (LabelInstr *)0x0) {
        local_40->field_0x78 = local_40->field_0x78 & 0xfd | labelHelper._7_1_ * '\x02';
        IR::Instr::InsertBefore(instr,&local_40->super_Instr);
        monoHelperWithoutFastPath = local_4c;
        polyHelperWithoutFastPath = local_4c;
        isHelper_00 = labelHelper._7_1_;
      }
    }
  }
  pIVar5 = LowerStFld(local_48,instr,monoHelperWithoutFastPath,polyHelperWithoutFastPath,true,
                      (LabelInstr *)0x0,(bool)isHelper_00,withPutFlags,flags);
  return pIVar5;
}

Assistant:

IR::Instr* Lowerer::GenerateCompleteStFld(IR::Instr* instr, bool emitFastPath, IR::JnHelperMethod monoHelperAfterFastPath, IR::JnHelperMethod polyHelperAfterFastPath,
    IR::JnHelperMethod monoHelperWithoutFastPath, IR::JnHelperMethod polyHelperWithoutFastPath, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    if(instr->CallsAccessor() && instr->HasBailOutInfo())
    {
        IR::BailOutKind kindMinusBits = instr->GetBailOutKind() & ~IR::BailOutKindBits;
        Assert(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp);
    }

    IR::Instr* prevInstr = instr->m_prev;

    IR::LabelInstr* labelBailOut = nullptr;
    IR::LabelInstr* labelHelper = nullptr;
    bool isHelper = false;
    IR::RegOpnd* typeOpnd = nullptr;
    if(emitFastPath && GenerateFastStFldForCustomProperty(instr, &labelHelper))
    {
        if(labelHelper)
        {
            Assert(labelHelper->isOpHelper);
            instr->InsertBefore(labelHelper);
            prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
        else
        {
            instr->Remove();
            return prevInstr;
        }
    }
    else if (this->GenerateStFldWithCachedType(instr, &isHelper, &labelHelper, &typeOpnd))
    {
        Assert(labelHelper == nullptr);
        return prevInstr;
    }
    else if (emitFastPath)
    {
        if (!GenerateFastStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, &labelBailOut, typeOpnd, &isHelper, &labelHelper, withPutFlags, flags))
        {
            if (labelHelper != nullptr)
            {
                labelHelper->isOpHelper = isHelper;
                instr->InsertBefore(labelHelper);
            }
            prevInstr = this->LowerStFld(instr, monoHelperAfterFastPath, polyHelperAfterFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
    }
    else
    {
        if (labelHelper != nullptr)
        {
            labelHelper->isOpHelper = isHelper;
            instr->InsertBefore(labelHelper);
        }
        prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, monoHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
    }

    return prevInstr;
}